

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::MetalMaterial::readFrom(MetalMaterial *this,BinaryReader *binary)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  BinaryReader *in_RSI;
  vec3f *in_RDI;
  
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<bool,void>(in_RSI,(bool *)in_RDI);
  BinaryReader::read(in_RSI,(int)in_RDI + 0x90,__buf,in_RCX);
  BinaryReader::read(in_RSI,(int)in_RDI + 0xd0,__buf_00,in_RCX);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  return;
}

Assistant:

void MetalMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(roughness);
    binary.read(uRoughness);
    binary.read(vRoughness);
    binary.read(remapRoughness);
    binary.read(spectrum_eta);
    binary.read(spectrum_k);
    binary.read(eta);
    binary.read(k);
    binary.read(map_bump);
    binary.read(map_roughness);
    binary.read(map_uRoughness);
    binary.read(map_vRoughness);
  }